

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::CharSet<char16_t>::SwitchRepresentations
          (CharSet<char16_t> *this,ArenaAllocator *allocator)

{
  code *pcVar1;
  bool bVar2;
  Char CVar3;
  undefined4 *puVar4;
  uint local_2c;
  uint local_28;
  uint i_1;
  uint i;
  Char existCs [4];
  uint existCount;
  ArenaAllocator *allocator_local;
  CharSet<char16_t> *this_local;
  
  unique0x10000153 = allocator;
  bVar2 = IsCompact(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x35f,"(IsCompact())","IsCompact()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  existCs._0_4_ = GetCompactLength(this);
  if ((uint)existCs._0_4_ < 5) {
    for (local_28 = 0; local_28 < (uint)existCs._0_4_; local_28 = local_28 + 1) {
      CVar3 = GetCompactChar(this,local_28);
      *(Char *)((long)&i_1 + (ulong)local_28 * 2) = CVar3;
    }
    (this->rep).compact.countPlusOne = 0;
    CharBitvec::Clear(&(this->rep).full.direct);
    for (local_2c = 0; local_2c < (uint)existCs._0_4_; local_2c = local_2c + 1) {
      Set(this,stack0xffffffffffffffe8,*(Char *)((long)&i_1 + (ulong)local_2c * 2));
    }
  }
  return;
}

Assistant:

void CharSet<char16>::SwitchRepresentations(ArenaAllocator* allocator)
    {
        Assert(IsCompact());
        uint existCount = this->GetCompactLength();
        __assume(existCount <= MaxCompact);
        if (existCount <= MaxCompact)
        {
            Char existCs[MaxCompact];
            for (uint i = 0; i < existCount; i++)
            {
                existCs[i] = GetCompactChar(i);
            }
            rep.full.root = nullptr;
            rep.full.direct.Clear();
            for (uint i = 0; i < existCount; i++)
                Set(allocator, existCs[i]);
        }
    }